

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

art_ref_t art_move_node_to_shrink(art_t *art,art_ref_t ref)

{
  ulong uVar1;
  size_t __n;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  byte bVar8;
  
  uVar6 = ref >> 0x10;
  uVar7 = ref & 0xff;
  uVar1 = art->first_free[uVar7];
  if (uVar1 <= uVar6) {
    bVar8 = (char)ref - 1;
    uVar5 = (ulong)(uint)((int)uVar7 * 8);
    __n = *(size_t *)((long)ART_NODE_SIZES + uVar5);
    lVar2 = *(long *)((long)art->nodes + uVar5);
    if (bVar8 < 5) {
      uVar5 = *(ulong *)(lVar2 + __n * uVar1);
    }
    else {
      uVar5 = 0;
    }
    memcpy((void *)(__n * uVar1 + lVar2),(void *)(lVar2 + __n * uVar6),__n);
    uVar4 = uVar5;
    uVar3 = uVar5;
    while (uVar4 < uVar6) {
      uVar3 = uVar4;
      if (bVar8 < 5) {
        uVar4 = *(ulong *)((long)art->nodes[uVar7] + (uVar4 & 0xffffffffffff) * __n);
      }
      else {
        uVar4 = 0;
      }
    }
    if ((bVar8 < 5) && (*(ulong *)((long)art->nodes[uVar7] + __n * uVar6) = uVar4, uVar3 < uVar6)) {
      *(ulong *)((long)art->nodes[uVar7] + (uVar3 & 0xffffffffffff) * __n) = uVar6;
    }
    ref = uVar1 << 0x10 | uVar7;
    if (uVar6 < uVar5) {
      uVar5 = uVar6;
    }
    art->first_free[uVar7] = uVar5;
  }
  return ref;
}

Assistant:

static art_ref_t art_move_node_to_shrink(art_t *art, art_ref_t ref) {
    uint64_t idx = art_ref_index(ref);
    art_typecode_t typecode = art_ref_typecode(ref);
    uint64_t first_free = art->first_free[typecode];
    assert(idx != first_free);
    if (idx < first_free) {
        return ref;
    }
    uint64_t from = idx;
    uint64_t to = first_free;
    uint64_t next_free = art_node_get_next_free(art, art_to_ref(to, typecode));
    memcpy(art_get_node(art, to, typecode), art_get_node(art, from, typecode),
           ART_NODE_SIZES[typecode]);

    // With an integer representing the next free index, and an `x` representing
    // an occupied index, assume the following scenario at the start of this
    // function:
    //     nodes = [1,2,5,x,x]
    //     first_free = 0
    //
    // We just moved a node from index 3 to 0:
    //     nodes = [x,2,5,?,x]
    //
    // We need to modify the free list so that the free indices are ascending.
    // This can be done by traversing the list until we find a node with a
    // `next_free` greater than the index we copied the node from, and inserting
    // the new index in between. This leads to the following:
    //     nodes = [x,2,3,5,x]
    //     first_free = 1
    uint64_t initial_next_free = next_free;
    uint64_t current = next_free;
    while (next_free < from) {
        current = next_free;
        next_free =
            art_node_get_next_free(art, art_to_ref(next_free, typecode));
    }
    art_node_set_next_free(art_deref(art, ref), typecode, next_free);
    if (current < from) {
        art_node_set_next_free(art_get_node(art, current, typecode), typecode,
                               from);
    }
    art->first_free[typecode] =
        from < initial_next_free ? from : initial_next_free;
    return art_to_ref(to, typecode);
}